

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj * display_minventory(monst *mon,int dflags,char *title)

{
  obj *poVar1;
  char *pcVar2;
  char *pcVar3;
  code *allow;
  bool bVar4;
  char *local_d8;
  char *local_d0;
  object_pick *poStack_b8;
  int do_all;
  object_pick *selected;
  char local_a8 [4];
  int n;
  char tmp [128];
  obj *ret;
  char *title_local;
  int dflags_local;
  monst *mon_local;
  
  poStack_b8 = (object_pick *)0x0;
  bVar4 = (dflags & 2U) != 0;
  pcVar2 = noit_Monnam(mon);
  pcVar2 = s_suffix(pcVar2);
  pcVar3 = "armament";
  if (bVar4) {
    pcVar3 = "possessions";
  }
  sprintf(local_a8,"%s %s:",pcVar2,pcVar3);
  if (bVar4) {
    poVar1 = mon->minvent;
joined_r0x001f9b76:
    if (poVar1 == (obj *)0x0) {
      local_d8 = title;
      if (title == (char *)0x0) {
        local_d8 = local_a8;
      }
      invdisp_nothing(local_d8,"(none)");
      selected._4_4_ = 0;
      goto LAB_001f9c4d;
    }
  }
  else if (mon->misc_worn_check == 0) {
    poVar1 = mon->mw;
    goto joined_r0x001f9b76;
  }
  youmonst.data = mon->data;
  local_d0 = title;
  if (title == (char *)0x0) {
    local_d0 = local_a8;
  }
  allow = worn_wield_only;
  if (bVar4) {
    allow = allow_all;
  }
  selected._4_4_ =
       query_objlist(local_d0,mon->minvent,8,&stack0xffffffffffffff48,(uint)((dflags & 1U) == 0),
                     allow);
  set_uasmon();
LAB_001f9c4d:
  if (selected._4_4_ < 1) {
    tmp[0x78] = '\0';
    tmp[0x79] = '\0';
    tmp[0x7a] = '\0';
    tmp[0x7b] = '\0';
    tmp[0x7c] = '\0';
    tmp[0x7d] = '\0';
    tmp[0x7e] = '\0';
    tmp[0x7f] = '\0';
  }
  else {
    tmp._120_8_ = poStack_b8->obj;
    free(poStack_b8);
  }
  return (obj *)tmp._120_8_;
}

Assistant:

struct obj *display_minventory(struct monst *mon, int dflags, char *title)
{
	struct obj *ret;
	char tmp[QBUFSZ];
	int n;
	struct object_pick *selected = NULL;
	int do_all = (dflags & MINV_ALL) != 0;

	sprintf(tmp,"%s %s:", s_suffix(noit_Monnam(mon)),
		do_all ? "possessions" : "armament");

	if (do_all ? (mon->minvent != 0)
		   : (mon->misc_worn_check || MON_WEP(mon))) {
	    /* Fool the 'weapon in hand' routine into
	     * displaying 'weapon in claw', etc. properly.
	     */
	    youmonst.data = mon->data;

	    n = query_objlist(title ? title : tmp, mon->minvent, INVORDER_SORT, &selected,
			(dflags & MINV_NOLET) ? PICK_NONE : PICK_ONE,
			do_all ? allow_all : worn_wield_only);

	    set_uasmon();
	} else {
	    invdisp_nothing(title ? title : tmp, "(none)");
	    n = 0;
	}

	if (n > 0) {
	    ret = selected[0].obj;
	    free(selected);
	} else
	    ret = NULL;
	return ret;
}